

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::MakeRational(ON_NurbsCurve *this)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  
  if (this->m_is_rat == 0) {
    uVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    uVar2 = this->m_cv_count;
    if ((0 < (int)uVar2) && (uVar3 = this->m_cv_stride, 0 < (int)uVar6 && (int)uVar6 <= (int)uVar3))
    {
      uVar8 = uVar6 + 1;
      if (uVar3 != uVar6) {
        uVar8 = uVar3;
      }
      ReserveCVCapacity(this,uVar8 * uVar2);
      pdVar4 = this->m_cv;
      lVar7 = (long)(int)uVar8;
      pdVar9 = pdVar4 + ((ulong)uVar2 - 1) * lVar7;
      uVar12 = (ulong)uVar2;
      do {
        uVar1 = uVar12 - 1;
        pdVar10 = pdVar4 + (long)this->m_cv_stride * uVar1;
        if (pdVar4 == (double *)0x0) {
          pdVar10 = (double *)0x0;
        }
        lVar11 = (ulong)uVar6 + 1;
        do {
          pdVar9[lVar11 + -2] = pdVar10[lVar11 + -2];
          lVar11 = lVar11 + -1;
        } while (1 < lVar11);
        pdVar4[uVar1 * lVar7 + (ulong)uVar6] = 1.0;
        pdVar9 = pdVar9 + -lVar7;
        bVar5 = 1 < (long)uVar12;
        uVar12 = uVar1;
      } while (bVar5);
      this->m_cv_stride = uVar8;
      this->m_is_rat = 1;
    }
  }
  return this->m_is_rat != 0;
}

Assistant:

bool ON_NurbsCurve::MakeRational()
{
  if ( !IsRational() ) {
    const int dim = Dimension();
    const int cv_count = CVCount();
    if ( cv_count > 0 && m_cv_stride >= dim && dim > 0 ) {
      const int new_stride = (m_cv_stride == dim) ? dim+1 : m_cv_stride;
      ReserveCVCapacity( cv_count*new_stride );
      const double* old_cv;
      double* new_cv;
      int cvi, j;
      for ( cvi = cv_count-1; cvi>=0; cvi-- ) {
        old_cv = CV(cvi);
        new_cv = m_cv+(cvi*new_stride);
        for ( j = dim-1; j >= 0; j-- ) {
          new_cv[j] = old_cv[j];
        }
        new_cv[dim] = 1.0;
      }
      m_cv_stride = new_stride;
      m_is_rat = 1;
    }
  }
  return IsRational();
}